

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_unitsNotEqualDifferingOrderOfUnits_Test::TestBody
          (Equality_unitsNotEqualDifferingOrderOfUnits_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertionResult local_280 [2];
  AssertHelper local_260 [8];
  Message local_258 [8];
  shared_ptr<libcellml::Entity> local_250;
  bool local_239;
  undefined1 local_238 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_208 [8];
  Message local_200 [8];
  shared_ptr<libcellml::Entity> local_1f8;
  bool local_1e1;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_;
  string local_1c8 [39];
  allocator<char> local_1a1;
  string local_1a0 [39];
  allocator<char> local_179;
  string local_178 [39];
  allocator<char> local_151;
  string local_150 [39];
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  UnitsPtr u2;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  UnitsPtr u1;
  Equality_unitsNotEqualDifferingOrderOfUnits_Test *this_local;
  
  u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"unitsA",&local_41);
  libcellml::Units::create((string *)local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,"unitsA",&local_89);
  libcellml::Units::create((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"metre",&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"",&local_d9);
  libcellml::Units::addUnit((string *)peVar3,3.0,local_b0);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"second",&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_128,"unit_id",&local_129);
  libcellml::Units::addUnit((string *)peVar3,1.0,local_100);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_150,"second",&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_178,"unit_id",&local_179);
  libcellml::Units::addUnit((string *)peVar3,2.0,local_150);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_179);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"metre",&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1c8,"",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::Units::addUnit((string *)peVar3,3.0,local_1a0);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Units,void>
            (&local_1f8,(shared_ptr<libcellml::Units> *)local_68);
  bVar1 = libcellml::Entity::equals((shared_ptr *)peVar3);
  local_1e1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1e0,&local_1e1,(type *)0x0);
  std::shared_ptr<libcellml::Entity>::~shared_ptr(&local_1f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar2) {
    testing::Message::Message(local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_1e0,"u1->equals(u2)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x154,pcVar4);
    testing::internal::AssertHelper::operator=(local_208,local_200);
    testing::internal::AssertHelper::~AssertHelper(local_208);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Units,void>
            (&local_250,(shared_ptr<libcellml::Units> *)local_20);
  bVar1 = libcellml::Entity::equals((shared_ptr *)peVar3);
  local_239 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_238,&local_239,(type *)0x0);
  std::shared_ptr<libcellml::Entity>::~shared_ptr(&local_250);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar2) {
    testing::Message::Message(local_258);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_280,local_238,"u2->equals(u1)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x155,pcVar4);
    testing::internal::AssertHelper::operator=(local_260,local_258);
    testing::internal::AssertHelper::~AssertHelper(local_260);
    std::__cxx11::string::~string((string *)local_280);
    testing::Message::~Message(local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_68);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_20);
  return;
}

Assistant:

TEST(Equality, unitsNotEqualDifferingOrderOfUnits)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("metre", 3.0);
    u1->addUnit("second", 1.0, "unit_id");
    u2->addUnit("second", 2.0, "unit_id");
    u2->addUnit("metre", 3.0);

    EXPECT_FALSE(u1->equals(u2));
    EXPECT_FALSE(u2->equals(u1));
}